

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<int,_unsigned_char>::Run
          (DataTransform<int,_unsigned_char> *this,istream *input_stream)

{
  byte bVar1;
  NumericType NVar2;
  WarningType WVar3;
  ostream *poVar4;
  uint uVar5;
  size_t *__idx;
  byte data_to_write;
  int iVar6;
  bool bVar7;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar8;
  allocator local_261;
  int input_data;
  int local_25c;
  string *local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_258 = &this->print_format_;
  iVar6 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar7 = word._M_string_length == 0;
      if (!bVar7) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        input_data = (int)ROUND(in_ST0);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
        local_25c = input_data;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar7) goto LAB_0011b756;
      if (bVar7) {
        if (!bVar7) {
          return false;
        }
        goto LAB_0011b8f7;
      }
    }
    else {
      bVar7 = sptk::ReadStream<int>(&input_data,input_stream);
      if (!bVar7) {
LAB_0011b8f7:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar6 % this->num_column_ != 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          return true;
        }
        return true;
      }
LAB_0011b756:
      data_to_write = this->minimum_value_;
      bVar1 = this->maximum_value_;
      if (data_to_write < bVar1) {
        uVar5 = (uint)data_to_write;
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          if (((int)uVar5 <= input_data) && (data_to_write = bVar1, input_data <= (int)(uint)bVar1))
          goto LAB_0011b7ba;
        }
        else if (NVar2 == kUnsignedInteger) {
          if (uVar5 <= (uint)input_data) {
LAB_0011b79f:
            bVar7 = (uint)bVar1 < (uint)input_data;
            uVar5 = input_data & 0xff;
            if (bVar7) {
              uVar5 = (uint)bVar1;
            }
            goto LAB_0011b7bf;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_0011b7ba;
          if ((int)uVar5 <= input_data) goto LAB_0011b79f;
        }
LAB_0011b7df:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar6);
          std::operator<<(poVar4,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_261);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      else {
LAB_0011b7ba:
        bVar7 = false;
        uVar5 = input_data;
LAB_0011b7bf:
        data_to_write = (byte)uVar5;
        if ((bVar7) || (this->rounding_ == false)) {
          if (bVar7) goto LAB_0011b7df;
        }
        else {
          if (input_data < 1) {
            dVar8 = (double)input_data + -0.5;
          }
          else {
            dVar8 = (double)input_data + 0.5;
          }
          data_to_write = (byte)(int)dVar8;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar7 = sptk::SnPrintf<unsigned_char>(data_to_write,local_258,0x80,buffer);
        if (!bVar7) {
          return false;
        }
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar6 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar7 = sptk::WriteStream<unsigned_char>(data_to_write,(ostream *)&std::cout);
        if (!bVar7) {
          return false;
        }
      }
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }